

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::operator*(mat3 *__return_storage_ptr__,float_t s,mat3 *m)

{
  vec3 vVar1;
  vec3 vVar2;
  vec3 vVar3;
  
  vVar1 = operator*(s,m->m);
  vVar2 = operator*(s,m->m + 1);
  vVar3 = operator*(s,m->m + 2);
  __return_storage_ptr__->m[0].x = (float_t)(int)vVar1._0_8_;
  __return_storage_ptr__->m[0].y = (float_t)(int)((ulong)vVar1._0_8_ >> 0x20);
  __return_storage_ptr__->m[0].z = vVar1.z;
  __return_storage_ptr__->m[1].x = (float_t)(int)vVar2._0_8_;
  __return_storage_ptr__->m[1].y = (float_t)(int)((ulong)vVar2._0_8_ >> 0x20);
  __return_storage_ptr__->m[1].z = vVar2.z;
  __return_storage_ptr__->m[2].x = (float_t)(int)vVar3._0_8_;
  __return_storage_ptr__->m[2].y = (float_t)(int)((ulong)vVar3._0_8_ >> 0x20);
  __return_storage_ptr__->m[2].z = vVar3.z;
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const float_t s, const mat3& m)
{
    return mat3(s * m[0], s * m[1], s * m[2]);
}